

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O2

void __thiscall OutputFile::add(OutputFile *this,string *key_arg,size_t value_arg)

{
  stringstream ss;
  string sStack_1c8;
  OutputFile *local_1a8;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  local_1a8 = allocKeyVal(key_arg,&sStack_1c8);
  std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::push_back
            (&this->descendants,&local_1a8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void
OutputFile::add(const string & key_arg, size_t value_arg) {
  stringstream ss;
  ss << value_arg;
  descendants.push_back(allocKeyVal(key_arg, ss.str()));
}